

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O3

bool __thiscall
DerBase::Decode<std::__cxx11::wstring>
          (DerBase *this,uchar *pIn,size_t cbIn,DerType type,size_t *cbUsed,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *value)

{
  uchar uVar1;
  pointer pwVar2;
  bool bVar3;
  out_of_range *this_00;
  long lVar4;
  size_t sVar5;
  size_t local_48;
  size_t size;
  DerBase *local_38;
  
  local_48 = 0;
  size = 0;
  value->_M_string_length = 0;
  pwVar2 = (value->_M_dataplus)._M_p;
  *pwVar2 = L'\0';
  local_38 = this;
  if (cbIn < 3) {
    if (cbIn == 2) {
      if (pIn[1] == '\0') {
        sVar5 = 2;
        lVar4 = 2;
        goto LAB_00138017;
      }
      uVar1 = *pIn;
      goto LAB_00137ff4;
    }
  }
  else {
    uVar1 = *pIn;
    if ((char)uVar1 < '\0' || uVar1 == (uchar)type) {
      bVar3 = DecodeSize(pIn + 1,cbIn - 1,&local_48,&size);
      if ((!bVar3) || (cbIn < size + local_48 + 1)) {
        this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(this_00,"Illegal size value");
        __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      lVar4 = size + 1;
      sVar5 = local_48;
LAB_00138017:
      *cbUsed = sVar5 + lVar4;
      std::__cxx11::wstring::_M_replace_dispatch<unsigned_char_const*>
                ((wstring *)value,pwVar2,pwVar2,pIn + lVar4,pIn + sVar5 + lVar4);
      local_38->cbData = value->_M_string_length;
      return true;
    }
LAB_00137ff4:
    if ((uVar1 == '\x05') && (pIn[1] == '\0')) {
      bVar3 = true;
      sVar5 = 2;
      goto LAB_00138003;
    }
  }
  sVar5 = 0;
  bVar3 = false;
LAB_00138003:
  *cbUsed = sVar5;
  return bVar3;
}

Assistant:

bool Decode(const unsigned char* pIn, size_t cbIn, const DerType type, size_t& cbUsed, T& value)
	{
		size_t size = 0;
		size_t cbPrefix = 0;

		value.clear();

		if (!CheckDecode(pIn, cbIn, type, size, cbPrefix))
		{
			// Allow Null, will correctly set cbUsed
			return DecodeNull(pIn, cbIn, cbUsed);
		}

		cbUsed = cbPrefix + static_cast<size_t>(size);
		value.insert(value.begin(), pIn + cbPrefix, pIn + cbUsed);
		cbData = value.size();
		return true;
	}